

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QString * __thiscall QDir::absoluteFilePath(QDir *this,QString *fileName)

{
  bool bVar1;
  QDirPrivate *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_char16_t> QVar2;
  QDirPrivate *d;
  QString absoluteDirPath;
  QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  CaseSensitivity in_stack_ffffffffffffff14;
  QString *in_stack_ffffffffffffff18;
  QChar in_stack_ffffffffffffff2e;
  QChar local_4a;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QString *local_30;
  char16_t local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = treatAsAbsolute(in_RDI);
  if (bVar1) {
    QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (QString *)in_stack_ffffffffffffff08);
  }
  else {
    d_func((QDir *)0x27d9f3);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QDirPrivate::resolveAbsoluteEntry(in_RSI);
    bVar1 = QString::isEmpty((QString *)0x27da41);
    if (bVar1) {
      QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (QString *)in_stack_ffffffffffffff08);
    }
    else {
      QChar::QChar<char16_t,_true>(&local_4a,L'/');
      bVar1 = QString::endsWith(in_stack_ffffffffffffff18,in_stack_ffffffffffffff2e,
                                in_stack_ffffffffffffff14);
      if (bVar1) {
        ::operator%(in_stack_ffffffffffffff18,
                    (QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString_&,_const_QString_&> *)in_stack_ffffffffffffff08);
      }
      else {
        QVar2 = ::operator%(in_stack_ffffffffffffff18,
                            (char16_t *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        local_30 = QVar2.a;
        local_28 = QVar2.b;
        ::operator%((QStringBuilder<QString_&,_char16_t> *)
                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    (QString *)in_stack_ffffffffffffff08);
        ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff08);
      }
    }
    QString::~QString((QString *)0x27dbca);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QDir::absoluteFilePath(const QString &fileName) const
{
    if (treatAsAbsolute(fileName))
        return fileName;

    Q_D(const QDir);
    QString absoluteDirPath = d->resolveAbsoluteEntry();
    if (fileName.isEmpty())
        return absoluteDirPath;
#ifdef Q_OS_WIN
    // Handle the "absolute except for drive" case (i.e. \blah not c:\blah):
    if (fileName.startsWith(u'/') || fileName.startsWith(u'\\')) {
        // Combine absoluteDirPath's drive with fileName
        const qsizetype drive = drivePrefixLength(absoluteDirPath);
        if (Q_LIKELY(drive))
            return QStringView{absoluteDirPath}.left(drive) % fileName;

        qWarning("Base directory's drive is not a letter: %s",
                 qUtf8Printable(QDir::toNativeSeparators(absoluteDirPath)));
        return QString();
    }
#endif // Q_OS_WIN
    if (!absoluteDirPath.endsWith(u'/'))
        return absoluteDirPath % u'/' % fileName;
    return absoluteDirPath % fileName;
}